

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

JSONWriter * __thiscall hgdb::json::JSONWriter::value<unsigned_int>(JSONWriter *this,uint value)

{
  uint value_local;
  JSONWriter *this_local;
  
  std::ostream::operator<<(&(this->s_).field_0x10,value);
  std::operator<<((ostream *)&(this->s_).field_0x10,',');
  return this;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }